

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O1

ProString * __thiscall
ProFile::getStr(ProString *__return_storage_ptr__,ProFile *this,ushort **tPtr)

{
  ushort uVar1;
  ushort *puVar2;
  char16_t *pcVar3;
  
  puVar2 = *tPtr;
  *tPtr = puVar2 + 1;
  uVar1 = *puVar2;
  *(undefined8 *)&__return_storage_ptr__->m_file = 0xaaaaaaaaaaaaaaaa;
  __return_storage_ptr__->m_hash = 0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_string).d.size = -0x5555555555555556;
  __return_storage_ptr__->m_offset = -0x55555556;
  __return_storage_ptr__->m_length = -0x55555556;
  (__return_storage_ptr__->m_string).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_string).d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  pcVar3 = (this->m_proitems).d.ptr;
  if (pcVar3 == (char16_t *)0x0) {
    pcVar3 = (char16_t *)&QString::_empty;
  }
  ProString::ProString
            (__return_storage_ptr__,&this->m_proitems,
             (int)((ulong)((long)puVar2 + (2 - (long)pcVar3)) >> 1),(uint)uVar1);
  __return_storage_ptr__->m_file = this->m_id;
  *tPtr = (ushort *)((long)*tPtr + (ulong)((uint)uVar1 + (uint)uVar1));
  return __return_storage_ptr__;
}

Assistant:

ProString ProFile::getStr(const ushort *&tPtr)
{
    uint len = *tPtr++;
    ProString ret(items(), tPtr - tokPtr(), len);
    ret.setSource(m_id);
    tPtr += len;
    return ret;
}